

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Start_Resume_R_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Start_Resume_R_PDU::Start_Resume_R_PDU
          (Start_Resume_R_PDU *this,EntityIdentifier *ReceivingEntity,
          EntityIdentifier *SupplyingEntity,ClockTime *RealWorldTime,ClockTime *SimTime,
          KUINT32 ReqID,RequiredReliabilityService RRS)

{
  Start_Resume_PDU::Start_Resume_PDU
            (&this->super_Start_Resume_PDU,ReceivingEntity,SupplyingEntity,RealWorldTime,SimTime,
             ReqID);
  Reliability_Header::Reliability_Header(&this->super_Reliability_Header,RRS);
  (this->super_Start_Resume_PDU).super_Simulation_Management_Header.super_Header.super_Header6.
  _vptr_Header6 = (_func_int **)&PTR__Start_Resume_R_PDU_00217020;
  (this->super_Reliability_Header)._vptr_Reliability_Header =
       (_func_int **)&PTR__Start_Resume_R_PDU_00217060;
  (this->super_Start_Resume_PDU).super_Simulation_Management_Header.super_Header.super_Header6.
  m_ui8PDUType = '5';
  (this->super_Start_Resume_PDU).super_Simulation_Management_Header.super_Header.super_Header6.
  m_ui8ProtocolFamily = '\n';
  (this->super_Start_Resume_PDU).super_Simulation_Management_Header.super_Header.super_Header6.
  m_ui16PDULength = 0x30;
  (this->super_Start_Resume_PDU).super_Simulation_Management_Header.super_Header.super_Header6.
  m_ui8ProtocolVersion = '\x06';
  return;
}

Assistant:

Start_Resume_R_PDU::Start_Resume_R_PDU( const EntityIdentifier & ReceivingEntity, const EntityIdentifier & SupplyingEntity, const ClockTime & RealWorldTime,
                                        const ClockTime & SimTime, KUINT32 ReqID, RequiredReliabilityService RRS ) :
    Start_Resume_PDU( ReceivingEntity, SupplyingEntity, RealWorldTime, SimTime, ReqID ),
    Reliability_Header( RRS )
{
    m_ui8PDUType = Start_Resume_R_PDU_Type;
    m_ui16PDULength = START_RESUME_R_PDU_SIZE;
    m_ui8ProtocolVersion = IEEE_1278_1A_1998;
    m_ui8ProtocolFamily = SimulationManagementwithReliability;
}